

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ivyFraig.c
# Opt level: O3

void Ivy_FraigAddClausesSuper(Ivy_FraigMan_t *p,Ivy_Obj_t *pNode,Vec_Ptr_t *vSuper)

{
  void **ppvVar1;
  int iVar2;
  lit *begin;
  long lVar3;
  long lVar4;
  
  if (((ulong)pNode & 1) != 0) {
    __assert_fail("!Ivy_IsComplement(pNode)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/ivy/ivyFraig.c"
                  ,0x987,"void Ivy_FraigAddClausesSuper(Ivy_FraigMan_t *, Ivy_Obj_t *, Vec_Ptr_t *)"
                 );
  }
  if ((*(uint *)&pNode->field_0x8 & 0xf) - 7 < 0xfffffffe) {
    __assert_fail("Ivy_ObjIsNode( pNode )",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/ivy/ivyFraig.c"
                  ,0x988,"void Ivy_FraigAddClausesSuper(Ivy_FraigMan_t *, Ivy_Obj_t *, Vec_Ptr_t *)"
                 );
  }
  lVar4 = (long)vSuper->nSize;
  begin = (lit *)malloc(lVar4 * 4 + 4);
  if (0 < lVar4) {
    lVar3 = 0;
    do {
      *begin = ((uint)vSuper->pArray[lVar3] & 1) +
               *(int *)(((ulong)vSuper->pArray[lVar3] & 0xfffffffffffffffe) + 0x28) * 2;
      begin[1] = *(int *)&pNode->pNextFan0 * 2 + 1;
      iVar2 = sat_solver_addclause(p->pSat,begin,begin + 2);
      if (iVar2 == 0) {
        __assert_fail("RetValue",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/ivy/ivyFraig.c"
                      ,0x993,
                      "void Ivy_FraigAddClausesSuper(Ivy_FraigMan_t *, Ivy_Obj_t *, Vec_Ptr_t *)");
      }
      lVar3 = lVar3 + 1;
      iVar2 = vSuper->nSize;
    } while (lVar3 < iVar2);
    if (0 < iVar2) {
      ppvVar1 = vSuper->pArray;
      lVar3 = 0;
      do {
        begin[lVar3] = ((uint)ppvVar1[lVar3] & 1) +
                       *(int *)(((ulong)ppvVar1[lVar3] & 0xfffffffffffffffe) + 0x28) * 2 ^ 1;
        lVar3 = lVar3 + 1;
      } while (iVar2 != lVar3);
    }
  }
  begin[lVar4] = *(int *)&pNode->pNextFan0 * 2;
  iVar2 = sat_solver_addclause(p->pSat,begin,begin + lVar4 + 1);
  if (iVar2 != 0) {
    free(begin);
    return;
  }
  __assert_fail("RetValue",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/ivy/ivyFraig.c"
                ,0x99a,"void Ivy_FraigAddClausesSuper(Ivy_FraigMan_t *, Ivy_Obj_t *, Vec_Ptr_t *)");
}

Assistant:

void Ivy_FraigAddClausesSuper( Ivy_FraigMan_t * p, Ivy_Obj_t * pNode, Vec_Ptr_t * vSuper )
{
    Ivy_Obj_t * pFanin;
    int * pLits, nLits, RetValue, i;
    assert( !Ivy_IsComplement(pNode) );
    assert( Ivy_ObjIsNode( pNode ) );
    // create storage for literals
    nLits = Vec_PtrSize(vSuper) + 1;
    pLits = ABC_ALLOC( int, nLits );
    // suppose AND-gate is A & B = C
    // add !A => !C   or   A + !C
    Vec_PtrForEachEntry( Ivy_Obj_t *, vSuper, pFanin, i )
    {
        pLits[0] = toLitCond(Ivy_ObjSatNum(Ivy_Regular(pFanin)), Ivy_IsComplement(pFanin));
        pLits[1] = toLitCond(Ivy_ObjSatNum(pNode), 1);
        RetValue = sat_solver_addclause( p->pSat, pLits, pLits + 2 );
        assert( RetValue );
    }
    // add A & B => C   or   !A + !B + C
    Vec_PtrForEachEntry( Ivy_Obj_t *, vSuper, pFanin, i )
        pLits[i] = toLitCond(Ivy_ObjSatNum(Ivy_Regular(pFanin)), !Ivy_IsComplement(pFanin));
    pLits[nLits-1] = toLitCond(Ivy_ObjSatNum(pNode), 0);
    RetValue = sat_solver_addclause( p->pSat, pLits, pLits + nLits );
    assert( RetValue );
    ABC_FREE( pLits );
}